

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# animation_engine.cpp
# Opt level: O1

void __thiscall
cppurses::Animation_engine::register_widget
          (Animation_engine *this,Widget *w,
          function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *period_func)

{
  Timer_event_loop *this_00;
  pointer *__ptr;
  _Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false> local_48;
  _Any_data local_40;
  code *local_30;
  
  this_00 = (Timer_event_loop *)operator_new(0x90);
  std::function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()>::function
            ((function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *)&local_40,
             period_func);
  detail::Timer_event_loop::Timer_event_loop
            (this_00,(function<std::chrono::duration<long,_std::ratio<1L,_1000L>_>_()> *)&local_40);
  local_48._M_head_impl = this_00;
  if (local_30 != (code *)0x0) {
    (*local_30)(&local_40,&local_40,__destroy_functor);
  }
  std::
  vector<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>,std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>>
  ::
  emplace_back<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>
            ((vector<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>,std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,std::default_delete<cppurses::detail::Timer_event_loop>>>>
              *)&this->variable_loops_,
             (unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
              *)&local_48);
  if (local_48._M_head_impl != (Timer_event_loop *)0x0) {
    (*((local_48._M_head_impl)->super_Event_loop)._vptr_Event_loop[1])();
  }
  detail::Timer_event_loop::register_widget
            ((this->variable_loops_).
             super__Vector_base<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
             ._M_t.
             super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
             .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl,w);
  Event_loop::run_async
            (&((this->variable_loops_).
               super__Vector_base<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>,_std::allocator<std::unique_ptr<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<cppurses::detail::Timer_event_loop,_std::default_delete<cppurses::detail::Timer_event_loop>_>
               ._M_t.
               super__Tuple_impl<0UL,_cppurses::detail::Timer_event_loop_*,_std::default_delete<cppurses::detail::Timer_event_loop>_>
               .super__Head_base<0UL,_cppurses::detail::Timer_event_loop_*,_false>._M_head_impl)->
              super_Event_loop);
  return;
}

Assistant:

void Animation_engine::register_widget(
    Widget& w,
    const std::function<Period_t()>& period_func)
{
    variable_loops_.emplace_back(
        std::make_unique<detail::Timer_event_loop>(period_func));
    variable_loops_.back()->register_widget(w);
    variable_loops_.back()->run_async();
}